

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

_Bool use_aux(command *cmd,object *obj,use use,wchar_t snd)

{
  uint32_t *puVar1;
  byte *pbVar2;
  loc grid;
  loc grid_00;
  loc grid_01;
  loc grid_02;
  bool bVar3;
  _Bool _Var4;
  _Bool aware;
  _Bool _Var5;
  char cVar6;
  _Bool _Var7;
  uint16_t uVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  trap_kind_conflict *ptVar11;
  effect *peVar12;
  undefined7 extraout_var;
  undefined6 extraout_var_00;
  player_upkeep *ppVar13;
  object *poVar14;
  int iVar15;
  long lVar16;
  short sVar17;
  char *pcVar18;
  player *p;
  char *pcVar19;
  byte bVar20;
  wchar_t beam;
  bool bVar21;
  source sVar22;
  source origin;
  _Bool ident;
  _Bool none_left;
  object *obj_local;
  object *work_obj;
  use local_b8;
  wchar_t local_b4;
  wchar_t dir;
  uint local_ac;
  trap_kind_conflict *local_a8;
  object *first_remainder;
  undefined4 local_94;
  effect *local_90;
  object *wcopy;
  
  obj_local = obj;
  local_b8 = use;
  local_b4 = snd;
  local_90 = object_effect(obj);
  _Var4 = object_is_carried(player,obj);
  none_left = false;
  dir = L'\x05';
  ptVar11 = lookup_trap("glyph of warding");
  wVar9 = cmd_get_arg_item((command_conflict *)cmd,"item",&obj_local);
  if (wVar9 != L'\0') {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                  ,0x1a4,"_Bool use_aux(struct command *, struct object *, enum use, int)");
  }
  aware = object_flavor_is_aware(obj_local);
  _Var5 = tval_is_wand(obj_local);
  bVar21 = true;
  if (((!_Var5) && (_Var5 = tval_is_rod(obj_local), !_Var5 && !aware)) &&
     ((obj_local->effect == (effect *)0x0 || (obj_local->known->effect != obj_local->effect)))) {
    if (obj_local->activation == (activation *)0x0) {
      bVar21 = false;
    }
    else {
      bVar21 = obj_local->known->activation == obj_local->activation;
    }
  }
  _Var5 = obj_needs_aim(obj_local);
  if (_Var5) {
    if (bVar21) {
      wVar9 = cmd_get_target((command_conflict *)cmd,"target",&dir);
      if (wVar9 != L'\0') {
        return false;
      }
    }
    else {
      uVar10 = Rand_div(8);
      dir = (wchar_t)ddd[(int)uVar10];
    }
    player_confuse_dir(player,&dir,false);
  }
  local_a8 = ptVar11;
  track_object(player->upkeep,obj_local);
  poVar14 = obj_local;
  if (local_90 == (effect *)0x0) {
    __assert_fail("effect",
                  "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                  ,0x1bf,"_Bool use_aux(struct command *, struct object *, enum use, int)");
  }
  if (local_b8 < USE_SINGLE) {
    _Var5 = tval_is_rod(obj_local);
    if (_Var5) {
      pcVar19 = "zap the rod";
LAB_0013075d:
      bVar21 = false;
    }
    else {
      _Var5 = tval_is_wand(poVar14);
      if (_Var5) {
        pcVar19 = "use the wand";
        pcVar18 = "Aim a wand";
LAB_00130751:
        if (poVar14->pval < 1) {
          event_signal(EVENT_INPUT_FLUSH);
          bVar21 = false;
          msg("The %s has no charges left.",pcVar18 + 6);
          goto LAB_00130ecc;
        }
        goto LAB_0013075d;
      }
      _Var5 = tval_is_staff(poVar14);
      if (_Var5) {
        pcVar19 = "use the staff";
        pcVar18 = "Use a staff";
        goto LAB_00130751;
      }
      pcVar19 = "activate it";
      bVar21 = true;
    }
    wVar9 = get_use_device_chance(poVar14);
    uVar10 = Rand_div(1000);
    if (uVar10 + L'\x01' < wVar9) {
      event_signal(EVENT_INPUT_FLUSH);
      msg("You failed to %s properly.",pcVar19);
      bVar21 = wVar9 < L'ϩ';
      goto LAB_00130ecc;
    }
    if (bVar21) {
      peVar12 = poVar14->effect;
      lVar16 = 0xf0;
      if (peVar12 == (effect *)0x0) {
        peVar12 = (effect *)poVar14->activation;
        lVar16 = 0x100;
        if (peVar12 == (effect *)0x0) goto LAB_001307da;
      }
      *(effect **)(poVar14->known->flags + lVar16 + -0x4c) = peVar12;
    }
  }
LAB_001307da:
  wVar9 = L'\n';
  if (obj_local->tval != '\x18') {
    wVar9 = L'\0';
  }
  beam = L'\x14';
  if (obj_local->tval != '\x17') {
    beam = wVar9;
  }
  ident = false;
  first_remainder = (object *)0x0;
  if (_Var4) {
    cVar6 = gear_to_label(player,obj_local);
    local_94 = (undefined4)CONCAT71(extraout_var,cVar6);
    if (local_b8 < USE_SINGLE) {
      local_ac = (uint)obj_local->number;
    }
    else {
      uVar8 = object_pack_total(player,obj_local,false,&first_remainder);
      local_ac = (uint)CONCAT62(extraout_var_00,uVar8);
      if ((first_remainder != (object *)0x0) && (uVar8 == first_remainder->number)) {
        first_remainder = (object *)0x0;
      }
    }
  }
  else {
    local_ac = (uint)obj_local->number;
    local_94 = 0;
  }
  if (obj_local->artifact == (artifact *)0x0) {
    if (obj_local->activation == (activation *)0x0) {
      wVar9 = obj_local->kind->level;
      goto LAB_001308fb;
    }
    wVar9 = obj_local->activation->level;
LAB_001308a1:
    msgt(local_b4,"You activate it.");
    if ((obj_local->activation != (activation *)0x0) &&
       (pcVar18 = obj_local->activation->message, pcVar18 != (char *)0x0)) {
      if ((obj_local->artifact == (artifact *)0x0) ||
         (pcVar19 = obj_local->artifact->alt_msg, pcVar19 == (char *)0x0)) {
        pcVar19 = pcVar18;
      }
      print_custom_message(obj_local,pcVar19,L'\0',player);
    }
  }
  else {
    wVar9 = obj_local->artifact->level;
    if (obj_local->activation != (activation *)0x0) goto LAB_001308a1;
LAB_001308fb:
    if ((obj_local->kind->effect_msg == (char *)0x0) &&
       ((obj_local->kind->vis_msg == (char *)0x0 || (player->timed[2] != 0)))) {
      sound(local_b4);
    }
    else {
      msgt(local_b4,"%s");
    }
  }
  iVar15 = (player->state).skills[2] - wVar9;
  wVar9 = L'\0';
  if (-2 < iVar15) {
    wVar9 = iVar15 / 2;
  }
  if (_Var4) {
    work_obj = object_new();
    object_copy(work_obj,obj_local);
    work_obj->oidx = 0;
    if (obj_local->known != (object *)0x0) {
      poVar14 = object_new();
      work_obj->known = poVar14;
      object_copy(poVar14,obj_local->known);
      work_obj->known->oidx = 0;
    }
    sVar17 = 0;
    bVar21 = false;
  }
  else if (local_b8 == USE_SINGLE) {
    sVar17 = 0;
    work_obj = floor_object_for_use(player,obj_local,L'\x01',false,&none_left);
    bVar21 = true;
  }
  else {
    if (local_b8 == USE_CHARGE) {
      sVar17 = obj_local->pval;
      obj_local->pval = sVar17 + -1;
LAB_00130a7d:
      bVar21 = true;
    }
    else {
      if (local_b8 == USE_TIMEOUT) {
        sVar17 = obj_local->timeout;
        iVar15 = randcalc(obj_local->time,0,RANDOMISE);
        obj_local->timeout = obj_local->timeout + (short)iVar15;
        goto LAB_00130a7d;
      }
      sVar17 = 0;
      bVar21 = false;
    }
    work_obj = object_new();
    object_copy(work_obj,obj_local);
    work_obj->oidx = 0;
    if (obj_local->known != (object *)0x0) {
      poVar14 = object_new();
      work_obj->known = poVar14;
      object_copy(poVar14,obj_local->known);
      work_obj->known->oidx = 0;
    }
  }
  target_fix();
  sVar22 = source_player();
  origin.which = sVar22.which;
  origin._4_4_ = 0;
  origin.what = sVar22.what;
  _Var5 = effect_do(local_90,origin,obj_local,&ident,aware,dir,beam,wVar9,cmd);
  target_release();
  if (_Var5) {
    if (local_b8 != USE_SINGLE) {
LAB_00130cad:
      _Var7 = tval_is_wearable(work_obj);
      if (_Var7) {
        update_player_object_knowledge(player);
      }
      else {
        if ((!aware) && (ident == true)) {
          object_learn_on_use(player,work_obj);
          bVar3 = true;
          bVar20 = 0;
          goto LAB_00130d05;
        }
        object_flavor_tried(work_obj);
      }
      bVar20 = 0;
      bVar3 = false;
      goto LAB_00130d05;
    }
    bVar3 = true;
    bVar20 = 1;
    if (!aware) goto LAB_00130c1c;
LAB_00130d0e:
    if (bVar21) goto LAB_00130d17;
    if (!_Var4) {
      __assert_fail("!from_floor",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                    ,0x293,"_Bool use_aux(struct command *, struct object *, enum use, int)");
    }
    if (local_b8 == USE_CHARGE) {
      obj_local->pval = obj_local->pval + -1;
      work_obj->pval = work_obj->pval + -1;
      if (bVar3) goto LAB_00130d23;
LAB_00130dd2:
      inven_item_charges(work_obj);
    }
    else {
      if (local_b8 == USE_TIMEOUT) {
        iVar15 = randcalc(obj_local->time,0,RANDOMISE);
        obj_local->timeout = obj_local->timeout + (short)iVar15;
        work_obj->timeout = work_obj->timeout + (short)iVar15;
      }
      else {
        if (bVar20 == 0) {
          bVar20 = 0;
          goto LAB_00130d17;
        }
        wcopy = gear_object_for_use(player,obj_local,L'\x01',false,&none_left);
        if (wcopy->known != (object *)0x0) {
          object_delete((chunk *)cave,(chunk *)player->cave,&wcopy->known);
        }
        object_delete((chunk *)cave,(chunk *)player->cave,&wcopy);
        bVar20 = 1;
      }
      if (bVar3) goto LAB_00130d23;
    }
  }
  else {
    if (bVar21) {
      if (local_b8 == USE_SINGLE) {
        wcopy = object_new();
        object_copy(wcopy,work_obj);
        if (work_obj->known != (object *)0x0) {
          poVar14 = object_new();
          wcopy->known = poVar14;
          object_copy(poVar14,work_obj->known);
        }
        if (_Var4) {
          inven_carry(player,wcopy,true,false);
        }
        else {
          grid.x = (player->grid).x;
          grid.y = (player->grid).y;
          drop_near((chunk *)cave,&wcopy,L'\0',grid,false,true);
        }
      }
      else if (local_b8 == USE_CHARGE) {
        obj_local->pval = sVar17;
      }
      else if (local_b8 == USE_TIMEOUT) {
        obj_local->timeout = sVar17;
      }
    }
    if ((aware) || (ident == false)) {
      if (work_obj->known != (object *)0x0) {
        object_delete((chunk *)player->cave,(chunk *)0x0,&work_obj->known);
      }
      object_delete((chunk *)cave,(chunk *)player->cave,&work_obj);
      if (bVar21) {
        if (_Var4) {
          __assert_fail("from_floor",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/cmd-obj.c"
                        ,0x271,"_Bool use_aux(struct command *, struct object *, enum use, int)");
        }
        puVar1 = &player->upkeep->redraw;
        *puVar1 = *puVar1 | 0x200000;
      }
      return false;
    }
    if (local_b8 != USE_SINGLE) goto LAB_00130cad;
LAB_00130c1c:
    object_learn_on_use(player,work_obj);
    bVar20 = 1;
    bVar3 = true;
LAB_00130d05:
    if (_Var5) goto LAB_00130d0e;
LAB_00130d17:
    if (bVar3) {
LAB_00130d23:
      object_desc((char *)&wcopy,0x50,work_obj,(local_ac - (_Var5 & bVar20)) * 0x10000 | 0x443,
                  player);
      if (_Var4) {
        if (first_remainder == (object *)0x0) {
          pcVar18 = "You have %s (%c).";
          cVar6 = (char)local_94;
        }
        else {
          cVar6 = gear_to_label(player,first_remainder);
          pcVar18 = "You have %s (1st %c).";
        }
        msg(pcVar18,&wcopy,(ulong)(uint)(int)cVar6);
      }
      else {
        msg("You see %s.");
      }
    }
    else if (_Var5 && local_b8 == USE_CHARGE) {
      if (_Var4) goto LAB_00130dd2;
      floor_item_charges(work_obj);
    }
  }
  if (work_obj->known != (object *)0x0) {
    object_delete((chunk *)player->cave,(chunk *)0x0,&work_obj->known);
  }
  object_delete((chunk *)cave,(chunk *)player->cave,&work_obj);
  bVar21 = false;
LAB_00130ecc:
  ptVar11 = local_a8;
  p = player;
  ppVar13 = player->upkeep;
  ppVar13->energy_use = (uint)z_info->move_energy;
  if (((~_Var4 | none_left) & 1U) == 0) {
    apply_autoinscription(p,obj_local);
    ppVar13 = player->upkeep;
    p = player;
  }
  *(byte *)&ppVar13->notice = (byte)ppVar13->notice | 1;
  pbVar2 = (byte *)((long)&ppVar13->redraw + 2);
  *pbVar2 = *pbVar2 | 0x26;
  grid_00.x = (p->grid).x;
  grid_00.y = (p->grid).y;
  _Var4 = square_trap_specific((chunk *)cave,grid_00,ptVar11->tidx);
  if ((_Var4) &&
     (grid_01.x = (player->grid).x, grid_01.y = (player->grid).y,
     poVar14 = square_object(cave,grid_01), poVar14 != (object *)0x0)) {
    grid_02.x = (player->grid).x;
    grid_02.y = (player->grid).y;
    push_object(grid_02);
  }
  return bVar21;
}

Assistant:

static bool use_aux(struct command *cmd, struct object *obj, enum use use,
					int snd)
{
	struct effect *effect = object_effect(obj);
	bool from_floor = !object_is_carried(player, obj);
	int can_use = 1;
	bool was_aware;
	bool known_aim = false;
	bool none_left = false;
	int dir = 5;
	struct trap_kind *rune = lookup_trap("glyph of warding");

	/* Get arguments */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) assert(0);

	was_aware = object_flavor_is_aware(obj);

	/* Determine whether we know an item needs to be be aimed */
	if (tval_is_wand(obj) || tval_is_rod(obj) || was_aware ||
		(obj->effect && (obj->known->effect == obj->effect)) ||
		(obj->activation && (obj->known->activation == obj->activation))) {
		known_aim = true;
	}

	if (obj_needs_aim(obj)) {
		/* Unknown things with no obvious aim get a random direction */
		if (!known_aim) {
			dir = ddd[randint0(8)];
		} else if (cmd_get_target(cmd, "target", &dir) != CMD_OK) {
			return false;
		}

		/* Confusion wrecks aim */
		player_confuse_dir(player, &dir, false);
	}

	/* track the object used */
	track_object(player->upkeep, obj);

	/* Verify effect */
	assert(effect);

	/* Check for use if necessary */
	if ((use == USE_CHARGE) || (use == USE_TIMEOUT)) {
		can_use = check_devices(obj);
	}

	/* Execute the effect */
	if (can_use > 0) {
		int beam = beam_chance(obj->tval);
		int boost, level, charges = 0;
		uint16_t number;
		bool ident = false, describe = false, deduct_before, used;
		struct object *work_obj;
		struct object *first_remainder = NULL;
		char label = '\0';

		if (from_floor) {
			number = obj->number;
		} else {
			label = gear_to_label(player, obj);
			/*
			 * Show an aggregate total if the description doesn't
			 * have a charge/recharging notice specific to the
			 * stack.
			 */
			if (use != USE_CHARGE && use != USE_TIMEOUT) {
				number = object_pack_total(player, obj, false,
					&first_remainder);
				if (first_remainder && first_remainder->number
						== number) {
					first_remainder = NULL;
				}
			} else {
				number = obj->number;
			}
		}

		/* Get the level */
		if (obj->artifact)
			level = obj->artifact->level;
		else if (obj->activation)
			level = obj->activation->level;
		else
			level = obj->kind->level;

		/* Sound and/or message */
		if (obj->activation) {
			msgt(snd, "You activate it.");
			activation_message(obj, player);
		} else if (obj->kind->effect_msg) {
			msgt(snd, "%s", obj->kind->effect_msg);
		} else if (obj->kind->vis_msg && !player->timed[TMD_BLIND]) {
			msgt(snd, "%s", obj->kind->vis_msg);
		} else {
			/* Make a noise! */
			sound(snd);
		}

		/* Boost damage effects if skill > difficulty */
		boost = MAX((player->state.skills[SKILL_DEVICE] - level) / 2, 0);

		/*
		 * If the object is on the floor, tentatively deduct the
		 * amount used - the effect could leave the object inaccessible
		 * making it difficult to do after a successful use.  For the
		 * same reason, get a copy of the object to use for propagating
		 * knowledge and messaging (also do so for items in the pack
		 * to keep later logic simpler).  Don't do the deduction for
		 * an object in the pack because the rearrangement of the
		 * pack, if using a stack of one single use item, can distract
		 * the player, see
		 * https://github.com/angband/angband/issues/5543 .
		 * If effects change so that the originating object can be
		 * destroyed even if in the pack, the deduction would have to
		 * be done here if the item is in the pack as well.
		 */
		if (from_floor) {
			if (use == USE_SINGLE) {
				deduct_before = true;
				work_obj = floor_object_for_use(player, obj, 1,
					false, &none_left);
			} else {
				if (use == USE_CHARGE) {
					deduct_before = true;
					charges = obj->pval;
					/* Use a single charge */
					obj->pval--;
				} else if (use == USE_TIMEOUT) {
					deduct_before = true;
					charges = obj->timeout;
					obj->timeout += randcalc(obj->time, 0,
						RANDOMISE);
				} else {
					deduct_before = false;
				}
				work_obj = object_new();
				object_copy(work_obj, obj);
				work_obj->oidx = 0;
				if (obj->known) {
					work_obj->known = object_new();
					object_copy(work_obj->known,
						obj->known);
					work_obj->known->oidx = 0;
				}
			}
		} else {
			deduct_before = false;
			work_obj = object_new();
			object_copy(work_obj, obj);
			work_obj->oidx = 0;
			if (obj->known) {
				work_obj->known = object_new();
				object_copy(work_obj->known, obj->known);
				work_obj->known->oidx = 0;
			}
		}

		/* Do effect; use original not copy (proj. effect handling) */
		target_fix();
		used = effect_do(effect,
							source_player(),
							obj,
							&ident,
							was_aware,
							dir,
							beam,
							boost,
							cmd);
		target_release();

		if (!used) {
			if (deduct_before) {
				/* Restore the tentative deduction. */
				if (use == USE_SINGLE) {
					/*
					 * Drop/stash copy to simplify
					 * subsequent logic.
					 */
					struct object *wcopy = object_new();

					object_copy(wcopy, work_obj);
					if (work_obj->known) {
						wcopy->known = object_new();
						object_copy(wcopy->known,
							work_obj->known);
					}
					if (from_floor) {
						drop_near(cave, &wcopy, 0,
							player->grid, false,
							true);
					} else {
						inven_carry(player, wcopy,
							true, false);
					}
				} else if (use == USE_CHARGE) {
					obj->pval = charges;
				} else if (use == USE_TIMEOUT) {
					obj->timeout = charges;
				}
			}

			/*
			 * Quit if the item wasn't used and no knowledge was
			 * gained
			 */
			if (was_aware || !ident) {
				if (work_obj->known) {
					object_delete(player->cave, NULL, &work_obj->known);
				}
				object_delete(cave, player->cave, &work_obj);
				/*
				 * Selection of effect's target may have
				 * triggered an update to windows while the
				 * tentative deduction was in effect; signal
				 * another update to remedy that.
				 */
				if (deduct_before) {
					assert(from_floor);
					player->upkeep->redraw |= (PR_OBJECT);
				}
				return false;
			}
		}

		/* Increase knowledge */
		if (use == USE_SINGLE) {
			/* Single use items are automatically learned */
			if (!was_aware) {
				object_learn_on_use(player, work_obj);
			}
			describe = true;
		} else {
			/* Wearables may need update, other things become known or tried */
			if (tval_is_wearable(work_obj)) {
				update_player_object_knowledge(player);
			} else if (!was_aware && ident) {
				object_learn_on_use(player, work_obj);
				describe = true;
			} else {
				object_flavor_tried(work_obj);
			}
		}

		/*
		 * Use up, deduct charge, or apply timeout if it wasn't
		 * done before.  For charges or timeouts, also have to change
		 * work_obj since it is used for messaging (for single use
		 * items, ODESC_ALTNUM means that the work_obj's number doesn't
		 * need to be adjusted).
		 */
		if (used && !deduct_before) {
			assert(!from_floor);
			if (use == USE_CHARGE) {
				obj->pval--;
				work_obj->pval--;
			} else if (use == USE_TIMEOUT) {
				int adj = randcalc(obj->time, 0, RANDOMISE);

				obj->timeout += adj;
				work_obj->timeout += adj;
			} else if (use == USE_SINGLE) {
				struct object *used_obj = gear_object_for_use(
					player, obj, 1, false, &none_left);

				if (used_obj->known) {
					object_delete(cave, player->cave,
						&used_obj->known);
				}
				object_delete(cave, player->cave, &used_obj);
			}
		}

		if (describe) {
			/*
			 * Describe what's left of single use items or newly
			 * identified items of all kinds.
			 */
			char name[80];

			object_desc(name, sizeof(name), work_obj,
				ODESC_PREFIX | ODESC_FULL | ODESC_ALTNUM |
				((number + ((used && use == USE_SINGLE) ?
				-1 : 0)) << 16), player);
			if (from_floor) {
				/* Print a message */
				msg("You see %s.", name);
			} else if (first_remainder) {
				label = gear_to_label(player, first_remainder);
				msg("You have %s (1st %c).", name, label);
			} else {
				msg("You have %s (%c).", name, label);
			}
		} else if (used && use == USE_CHARGE) {
			/* Describe charges */
			if (from_floor)
				floor_item_charges(work_obj);
			else
				inven_item_charges(work_obj);
		}

		/* Clean up created copy. */
		if (work_obj->known)
			object_delete(player->cave, NULL, &work_obj->known);
		object_delete(cave, player->cave, &work_obj);
	}

	/* Use the turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Autoinscribe if we are guaranteed to still have any */
	if (!none_left && !from_floor)
		apply_autoinscription(player, obj);

	/* Mark as tried and redisplay */
	player->upkeep->notice |= (PN_COMBINE);
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP | PR_OBJECT);

	/* Hack to make Glyph of Warding work properly */
	if (square_trap_specific(cave, player->grid, rune->tidx)) {
		/* Push objects off the grid */
		if (square_object(cave, player->grid))
			push_object(player->grid);
	}

	return can_use == 0;
}